

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_type_range
                 (lysc_ctx *ctx,lysp_restr *range_p,LY_DATA_TYPE basetype,ly_bool length_restr,
                 uint8_t frdigits,lysc_range *base_range,lysc_range **range)

{
  anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *paVar1;
  char cVar2;
  lysc_range_part *plVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  lysp_restr *plVar7;
  ushort **ppuVar8;
  undefined8 *puVar9;
  long lVar10;
  long *plVar11;
  lysc_range *plVar12;
  uint uVar13;
  long prev;
  int64_t iVar14;
  ulong uVar15;
  char *pcVar16;
  lysc_range_part *part;
  ulong uVar17;
  ly_ctx *plVar18;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  char **value;
  LY_ERR local_64;
  long local_58;
  char *local_50;
  lysc_range *local_48;
  ulong local_40;
  lysp_restr *local_38;
  
  local_48 = base_range;
  if (range == (lysc_range **)0x0) {
    __assert_fail("range",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x360,
                  "LY_ERR lys_compile_type_range(struct lysc_ctx *, const struct lysp_restr *, LY_DATA_TYPE, ly_bool, uint8_t, struct lysc_range *, struct lysc_range **)"
                 );
  }
  if (range_p == (lysp_restr *)0x0) {
    __assert_fail("range_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x361,
                  "LY_ERR lys_compile_type_range(struct lysc_ctx *, const struct lysp_restr *, LY_DATA_TYPE, ly_bool, uint8_t, struct lysc_range *, struct lysc_range **)"
                 );
  }
  pcVar20 = (range_p->arg).str;
  part = (lysc_range_part *)0x0;
  local_50 = pcVar20;
  local_38 = range_p;
  ppuVar8 = __ctype_b_loc();
  local_40 = (ulong)frdigits;
  bVar6 = false;
  local_58 = 0;
LAB_001420cb:
  do {
    while( true ) {
      while( true ) {
        plVar7 = local_38;
        cVar2 = *pcVar20;
        if (((*ppuVar8)[cVar2] >> 0xd & 1) == 0) break;
        pcVar20 = pcVar20 + 1;
        local_50 = pcVar20;
      }
      if (cVar2 == '\0') {
        if (bVar6) {
          plVar18 = ctx->ctx;
          pcVar21 = "length";
          if (length_restr == '\0') {
            pcVar21 = "range";
          }
          pcVar20 = (local_38->arg).str;
          pcVar16 = "Invalid %s restriction - unexpected end of the expression after \"..\" (%s).";
          goto LAB_0014277c;
        }
        if ((part == (lysc_range_part *)0x0) || (local_58 == part[-1].field_1.max_64)) {
          plVar18 = ctx->ctx;
          pcVar21 = "length";
          if (length_restr == '\0') {
            pcVar21 = "range";
          }
          pcVar20 = (local_38->arg).str;
          pcVar16 = "Invalid %s restriction - unexpected end of the expression (%s).";
          goto LAB_0014277c;
        }
        if (local_48 == (lysc_range *)0x0) goto LAB_00142806;
        uVar13 = basetype - LY_TYPE_BINARY;
        if ((uVar13 < 0x13) && ((0x7813fU >> (uVar13 & 0x1f) & 1) != 0)) {
          uVar13 = 0x78100 >> ((byte)uVar13 & 0x1f);
          uVar15 = 0;
          uVar17 = 0;
          goto LAB_00142676;
        }
        local_64 = LY_EINT;
        ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
               ,0x3da);
        goto LAB_0014278f;
      }
      if (cVar2 == 'm') break;
      if (cVar2 == '.') {
        if (pcVar20[1] != '.') goto LAB_00142205;
        pcVar21 = pcVar20 + 2;
        do {
          pcVar20 = pcVar21;
          pcVar21 = pcVar20 + 1;
        } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar20 * 2 + 1) & 0x20) != 0);
        local_50 = pcVar20;
        if ((part == (lysc_range_part *)0x0) || (bVar6 = true, part[-1].field_1.max_64 == local_58))
        {
          pcVar20 = "length";
          if (length_restr == '\0') {
            pcVar20 = "range";
          }
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid %s restriction - unexpected \"..\" without a lower bound.",pcVar20);
          goto LAB_00142783;
        }
      }
      else {
        if (cVar2 != '|') goto LAB_00142205;
        if ((part == (lysc_range_part *)0x0) || (bVar6)) {
          plVar18 = ctx->ctx;
          pcVar21 = "length";
          if (length_restr == '\0') {
            pcVar21 = "range";
          }
          pcVar16 = "Invalid %s restriction - unexpected beginning of the expression (%s).";
          goto LAB_0014277c;
        }
        local_50 = pcVar20 + 1;
        local_58 = local_58 + 1;
LAB_001423e4:
        bVar6 = false;
        pcVar20 = local_50;
      }
    }
    if ((pcVar20[1] == 'i') && (pcVar20[2] == 'n')) {
      if (part != (lysc_range_part *)0x0) {
        pcVar21 = "length";
        if (length_restr == '\0') {
          pcVar21 = "range";
        }
        pcVar16 = (local_38->arg).str;
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid %s restriction - unexpected data before min keyword (%.*s).",pcVar21,
                (ulong)(uint)((int)pcVar20 - (int)pcVar16),pcVar16);
        local_64 = LY_EVALID;
        break;
      }
      local_50 = pcVar20 + 3;
      puVar9 = (undefined8 *)malloc(0x18);
      if (puVar9 == (undefined8 *)0x0) goto LAB_00142919;
      *puVar9 = 1;
      part = (lysc_range_part *)(puVar9 + 1);
      puVar9[1] = 0;
      puVar9[2] = 0;
      local_64 = range_part_minmax(ctx,part,'\0',0,basetype,'\x01',length_restr,(uint8_t)local_40,
                                   local_48,(char **)0x0);
      if (local_64 != LY_SUCCESS) break;
      puVar9[2] = puVar9[1];
      pcVar20 = local_50;
      goto LAB_001420cb;
    }
LAB_00142205:
    if (((((*ppuVar8)[cVar2] >> 0xb & 1) == 0) && (cVar2 != '-')) && (cVar2 != '+')) {
      if (((cVar2 != 'm') || (pcVar20[1] != 'a')) || (pcVar20[2] != 'x')) {
        plVar18 = ctx->ctx;
        pcVar21 = "length";
        if (length_restr == '\0') {
          pcVar21 = "range";
        }
        pcVar16 = "Invalid %s restriction - unexpected data (%s).";
        goto LAB_0014277c;
      }
      pcVar21 = pcVar20 + 3;
      do {
        pcVar20 = pcVar21;
        pcVar21 = pcVar20 + 1;
      } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar20 * 2 + 1) & 0x20) != 0);
      local_50 = pcVar20;
      if (*pcVar20 != '\0') {
        plVar18 = ctx->ctx;
        pcVar21 = "length";
        if (length_restr == '\0') {
          pcVar21 = "range";
        }
        pcVar16 = "Invalid %s restriction - unexpected data after max keyword (%s).";
        goto LAB_0014277c;
      }
      if (!bVar6) {
        if (part == (lysc_range_part *)0x0) {
          plVar11 = (long *)malloc(0x18);
          if (plVar11 == (long *)0x0) goto LAB_00142919;
          *plVar11 = 1;
          lVar10 = 1;
        }
        else {
          paVar1 = &part[-1].field_1;
          lVar10 = part[-1].field_1.max_64 + 1;
          part[-1].field_1.max_64 = lVar10;
          plVar11 = (long *)realloc(paVar1,lVar10 * 0x10 | 8);
          if (plVar11 == (long *)0x0) {
            paVar1->max_64 = paVar1->max_64 + -1;
            plVar18 = ctx->ctx;
            goto LAB_00142627;
          }
          lVar10 = *plVar11;
        }
        part = (lysc_range_part *)(plVar11 + 1);
        plVar11[lVar10 * 2 + -1] = 0;
        (plVar11 + lVar10 * 2 + -1)[1] = 0;
        if (local_58 == 0) {
          iVar14 = 0;
        }
        else {
          iVar14 = part[*plVar11 + -2].field_1.max_64;
        }
        local_64 = range_part_minmax(ctx,(lysc_range_part *)(plVar11 + lVar10 * 2 + -1),'\x01',
                                     iVar14,basetype,local_58 == 0,length_restr,(uint8_t)local_40,
                                     local_48,(char **)0x0);
        if (local_64 == LY_SUCCESS) {
          (plVar11 + lVar10 * 2)[-1] = plVar11[lVar10 * 2];
          goto LAB_001423e4;
        }
        break;
      }
      lVar10 = -1;
      if (part != (lysc_range_part *)0x0) {
        lVar10 = part[-1].field_1.max_64 + -1;
      }
      prev = part[lVar10].field_0.min_64;
      value = (char **)0x0;
      plVar12 = local_48;
    }
    else {
      if (!bVar6) {
        if (part == (lysc_range_part *)0x0) {
          plVar11 = (long *)malloc(0x18);
          if (plVar11 == (long *)0x0) goto LAB_00142919;
          *plVar11 = 1;
          lVar10 = 1;
        }
        else {
          paVar1 = &part[-1].field_1;
          lVar10 = part[-1].field_1.max_64 + 1;
          part[-1].field_1.max_64 = lVar10;
          plVar11 = (long *)realloc(paVar1,lVar10 * 0x10 | 8);
          if (plVar11 == (long *)0x0) {
            paVar1->max_64 = paVar1->max_64 + -1;
            plVar18 = ctx->ctx;
LAB_00142627:
            local_64 = LY_EMEM;
            ly_log(plVar18,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_compile_type_range");
            break;
          }
          lVar10 = *plVar11;
        }
        part = (lysc_range_part *)(plVar11 + 1);
        plVar11[lVar10 * 2 + -1] = 0;
        (plVar11 + lVar10 * 2 + -1)[1] = 0;
        if (local_58 == 0) {
          iVar14 = 0;
        }
        else {
          iVar14 = part[*plVar11 + -2].field_1.max_64;
        }
        local_64 = range_part_minmax(ctx,(lysc_range_part *)(plVar11 + lVar10 * 2 + -1),'\0',iVar14,
                                     basetype,local_58 == 0,length_restr,(uint8_t)local_40,
                                     (lysc_range *)0x0,&local_50);
        if (local_64 == LY_SUCCESS) {
          plVar11[lVar10 * 2] = (plVar11 + lVar10 * 2)[-1];
          goto LAB_001423e4;
        }
        break;
      }
      lVar10 = -1;
      if (part != (lysc_range_part *)0x0) {
        lVar10 = part[-1].field_1.max_64 + -1;
      }
      prev = part[lVar10].field_0.min_64;
      value = &local_50;
      plVar12 = (lysc_range *)0x0;
    }
    bVar6 = false;
    local_64 = range_part_minmax(ctx,part + lVar10,'\x01',prev,basetype,'\0',length_restr,
                                 (uint8_t)local_40,plVar12,value);
    pcVar20 = local_50;
  } while (local_64 == LY_SUCCESS);
  goto LAB_0014278f;
LAB_00142676:
  if (local_58 + 1U <= uVar15) goto LAB_001427fb;
  plVar3 = local_48->parts;
  if (plVar3 == (lysc_range_part *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = plVar3[-1].field_1.max_u64;
  }
  if (uVar19 <= uVar17) goto LAB_001427fb;
  uVar19 = part[uVar15].field_0.min_u64;
  uVar4 = plVar3[uVar17].field_0.min_u64;
  if ((uVar13 & 1) == 0) {
    if (uVar19 < uVar4) goto LAB_00142940;
  }
  else if ((long)uVar19 < (long)uVar4) goto LAB_00142940;
  uVar5 = plVar3[uVar17].field_1.max_u64;
  if (uVar4 == uVar5) {
    if (uVar4 == uVar19) {
      if (uVar19 != part[uVar15].field_1.max_64) goto LAB_00142940;
LAB_00142744:
      uVar17 = uVar17 + 1;
    }
    else {
LAB_0014270e:
      uVar17 = uVar17 + 1;
      uVar15 = uVar15 - 1;
    }
  }
  else {
    uVar4 = part[uVar15].field_1.max_u64;
    if (uVar19 != uVar4) {
      if ((uVar5 < uVar4 & ((byte)uVar13 ^ 1)) == 0) {
        if (((long)uVar5 < (long)uVar4 & (byte)uVar13) == 0) goto LAB_00142747;
        if ((long)uVar19 <= (long)uVar5) goto LAB_00142940;
      }
      else if (uVar19 <= uVar5) goto LAB_00142940;
      uVar15 = uVar15 - 1;
      goto LAB_00142744;
    }
    bVar6 = uVar5 < uVar19;
    if ((uVar13 & 1) != 0) {
      bVar6 = (long)uVar5 < (long)uVar19;
    }
    if (bVar6) goto LAB_0014270e;
  }
LAB_00142747:
  uVar15 = uVar15 + 1;
  goto LAB_00142676;
LAB_001427fb:
  if (uVar15 == local_58 + 1U) {
LAB_00142806:
    plVar12 = *range;
    if (plVar12 == (lysc_range *)0x0) {
      plVar12 = (lysc_range *)calloc(1,0x30);
      *range = plVar12;
      if (plVar12 == (lysc_range *)0x0) {
LAB_00142919:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_range"
              );
        return LY_EMEM;
      }
    }
    if (plVar7->eapptag != (char *)0x0) {
      lydict_remove(ctx->ctx,plVar12->eapptag);
      local_64 = lydict_insert(ctx->ctx,plVar7->eapptag,0,&(*range)->eapptag);
      if (local_64 != LY_SUCCESS) goto LAB_0014278a;
      plVar12 = *range;
    }
    if (plVar7->emsg != (char *)0x0) {
      lydict_remove(ctx->ctx,plVar12->emsg);
      local_64 = lydict_insert(ctx->ctx,plVar7->emsg,0,&(*range)->emsg);
      if (local_64 != LY_SUCCESS) goto LAB_0014278a;
      plVar12 = *range;
    }
    if (plVar7->dsc != (char *)0x0) {
      lydict_remove(ctx->ctx,plVar12->dsc);
      local_64 = lydict_insert(ctx->ctx,plVar7->dsc,0,&(*range)->dsc);
      if (local_64 != LY_SUCCESS) goto LAB_0014278a;
      plVar12 = *range;
    }
    if (plVar7->ref == (char *)0x0) {
LAB_00142909:
      plVar12->parts = part;
      return LY_SUCCESS;
    }
    lydict_remove(ctx->ctx,plVar12->ref);
    local_64 = lydict_insert(ctx->ctx,plVar7->ref,0,&(*range)->ref);
    if (local_64 == LY_SUCCESS) {
      plVar12 = *range;
      goto LAB_00142909;
    }
  }
  else {
LAB_00142940:
    plVar18 = ctx->ctx;
    pcVar21 = "length";
    if (length_restr == '\0') {
      pcVar21 = "range";
    }
    pcVar20 = (local_38->arg).str;
    pcVar16 = 
    "Invalid %s restriction - the derived restriction (%s) is not equally or more limiting.";
LAB_0014277c:
    ly_vlog(plVar18,(char *)0x0,LYVE_SYNTAX_YANG,pcVar16,pcVar21,pcVar20);
LAB_00142783:
    local_64 = LY_EVALID;
  }
LAB_0014278a:
  if (part == (lysc_range_part *)0x0) {
    return local_64;
  }
LAB_0014278f:
  free(&part[-1].field_1);
  return local_64;
}

Assistant:

LY_ERR
lys_compile_type_range(struct lysc_ctx *ctx, const struct lysp_restr *range_p, LY_DATA_TYPE basetype, ly_bool length_restr,
        uint8_t frdigits, struct lysc_range *base_range, struct lysc_range **range)
{
    LY_ERR ret = LY_SUCCESS;
    const char *expr;
    struct lysc_range_part *parts = NULL, *part;
    ly_bool range_expected = 0, uns;
    LY_ARRAY_COUNT_TYPE parts_done = 0, u, v;

    assert(range);
    assert(range_p);

    expr = range_p->arg.str;
    while (1) {
        if (isspace(*expr)) {
            ++expr;
        } else if (*expr == '\0') {
            if (range_expected) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected end of the expression after \"..\" (%s).",
                        length_restr ? "length" : "range", range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            } else if (!parts || (parts_done == LY_ARRAY_COUNT(parts))) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected end of the expression (%s).",
                        length_restr ? "length" : "range", range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            }
            parts_done++;
            break;
        } else if (!strncmp(expr, "min", ly_strlen_const("min"))) {
            if (parts) {
                /* min cannot be used elsewhere than in the first part */
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected data before min keyword (%.*s).", length_restr ? "length" : "range",
                        (int)(expr - range_p->arg.str), range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            }
            expr += ly_strlen_const("min");

            LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
            LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 0, 0, basetype, 1, length_restr, frdigits, base_range, NULL), cleanup);
            part->max_64 = part->min_64;
        } else if (*expr == '|') {
            if (!parts || range_expected) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected beginning of the expression (%s).", length_restr ? "length" : "range", expr);
                ret = LY_EVALID;
                goto cleanup;
            }
            expr++;
            parts_done++;
            /* process next part of the expression */
        } else if (!strncmp(expr, "..", 2)) {
            expr += 2;
            while (isspace(*expr)) {
                expr++;
            }
            if (!parts || (LY_ARRAY_COUNT(parts) == parts_done)) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected \"..\" without a lower bound.", length_restr ? "length" : "range");
                ret = LY_EVALID;
                goto cleanup;
            }
            /* continue expecting the upper boundary */
            range_expected = 1;
        } else if (isdigit(*expr) || (*expr == '-') || (*expr == '+')) {
            /* number */
            if (range_expected) {
                part = &parts[LY_ARRAY_COUNT(parts) - 1];
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, part->min_64, basetype, 0, length_restr, frdigits, NULL, &expr), cleanup);
                range_expected = 0;
            } else {
                LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 0, parts_done ? parts[LY_ARRAY_COUNT(parts) - 2].max_64 : 0,
                        basetype, parts_done ? 0 : 1, length_restr, frdigits, NULL, &expr), cleanup);
                part->max_64 = part->min_64;
            }

            /* continue with possible another expression part */
        } else if (!strncmp(expr, "max", ly_strlen_const("max"))) {
            expr += ly_strlen_const("max");
            while (isspace(*expr)) {
                expr++;
            }
            if (*expr != '\0') {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s restriction - unexpected data after max keyword (%s).",
                        length_restr ? "length" : "range", expr);
                ret = LY_EVALID;
                goto cleanup;
            }
            if (range_expected) {
                part = &parts[LY_ARRAY_COUNT(parts) - 1];
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, part->min_64, basetype, 0, length_restr, frdigits, base_range, NULL), cleanup);
                range_expected = 0;
            } else {
                LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, parts_done ? parts[LY_ARRAY_COUNT(parts) - 2].max_64 : 0,
                        basetype, parts_done ? 0 : 1, length_restr, frdigits, base_range, NULL), cleanup);
                part->min_64 = part->max_64;
            }
        } else {
            LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s restriction - unexpected data (%s).",
                    length_restr ? "length" : "range", expr);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    /* check with the previous range/length restriction */
    if (base_range) {
        switch (basetype) {
        case LY_TYPE_BINARY:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
        case LY_TYPE_STRING:
            uns = 1;
            break;
        case LY_TYPE_DEC64:
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
            uns = 0;
            break;
        default:
            LOGINT(ctx->ctx);
            ret = LY_EINT;
            goto cleanup;
        }
        for (u = v = 0; u < parts_done && v < LY_ARRAY_COUNT(base_range->parts); ++u) {
            if ((uns && (parts[u].min_u64 < base_range->parts[v].min_u64)) || (!uns && (parts[u].min_64 < base_range->parts[v].min_64))) {
                goto baseerror;
            }
            /* current lower bound is not lower than the base */
            if (base_range->parts[v].min_64 == base_range->parts[v].max_64) {
                /* base has single value */
                if (base_range->parts[v].min_64 == parts[u].min_64) {
                    /* both lower bounds are the same */
                    if (parts[u].min_64 != parts[u].max_64) {
                        /* current continues with a range */
                        goto baseerror;
                    } else {
                        /* equal single values, move both forward */
                        ++v;
                        continue;
                    }
                } else {
                    /* base is single value lower than current range, so the
                     * value from base range is removed in the current,
                     * move only base and repeat checking */
                    ++v;
                    --u;
                    continue;
                }
            } else {
                /* base is the range */
                if (parts[u].min_64 == parts[u].max_64) {
                    /* current is a single value */
                    if ((uns && (parts[u].max_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].max_64 > base_range->parts[v].max_64))) {
                        /* current is behind the base range, so base range is omitted,
                         * move the base and keep the current for further check */
                        ++v;
                        --u;
                    } /* else it is within the base range, so move the current, but keep the base */
                    continue;
                } else {
                    /* both are ranges - check the higher bound, the lower was already checked */
                    if ((uns && (parts[u].max_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].max_64 > base_range->parts[v].max_64))) {
                        /* higher bound is higher than the current higher bound */
                        if ((uns && (parts[u].min_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].min_64 > base_range->parts[v].max_64))) {
                            /* but the current lower bound is also higher, so the base range is omitted,
                             * continue with the same current, but move the base */
                            --u;
                            ++v;
                            continue;
                        }
                        /* current range starts within the base range but end behind it */
                        goto baseerror;
                    } else {
                        /* current range is smaller than the base,
                         * move current, but stay with the base */
                        continue;
                    }
                }
            }
        }
        if (u != parts_done) {
baseerror:
            LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                    "Invalid %s restriction - the derived restriction (%s) is not equally or more limiting.",
                    length_restr ? "length" : "range", range_p->arg.str);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    if (!(*range)) {
        *range = calloc(1, sizeof **range);
        LY_CHECK_ERR_RET(!(*range), LOGMEM(ctx->ctx), LY_EMEM);
    }

    /* we rewrite the following values as the types chain is being processed */
    if (range_p->eapptag) {
        lydict_remove(ctx->ctx, (*range)->eapptag);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->eapptag, 0, &(*range)->eapptag), cleanup);
    }
    if (range_p->emsg) {
        lydict_remove(ctx->ctx, (*range)->emsg);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->emsg, 0, &(*range)->emsg), cleanup);
    }
    if (range_p->dsc) {
        lydict_remove(ctx->ctx, (*range)->dsc);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->dsc, 0, &(*range)->dsc), cleanup);
    }
    if (range_p->ref) {
        lydict_remove(ctx->ctx, (*range)->ref);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->ref, 0, &(*range)->ref), cleanup);
    }
    /* extensions are taken only from the last range by the caller */

    (*range)->parts = parts;
    parts = NULL;
cleanup:
    LY_ARRAY_FREE(parts);

    return ret;
}